

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O0

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *this_00;
  Expression *pEVar1;
  InputDeclaration *pIVar2;
  ReadStream *pRVar3;
  ReadStream *old_local;
  ModuleCloner *this_local;
  
  this_00 = this->newModule;
  pEVar1 = pool_ptr<soul::heart::Expression>::operator*
                     ((pool_ptr<soul::heart::Expression> *)(__fn + 0x20));
  pEVar1 = cloneExpression(this,pEVar1);
  pIVar2 = pool_ref::operator_cast_to_InputDeclaration_((pool_ref *)(__fn + 0x28));
  pIVar2 = getRemappedInput(this,pIVar2);
  pRVar3 = Module::
           allocate<soul::heart::ReadStream,soul::CodeLocation_const&,soul::heart::Expression&,soul::heart::InputDeclaration&>
                     (this_00,(CodeLocation *)(__fn + 8),pEVar1,pIVar2);
  return (int)pRVar3;
}

Assistant:

heart::ReadStream& clone (const heart::ReadStream& old)
    {
        return newModule.allocate<heart::ReadStream> (old.location,
                                                      cloneExpression (*old.target),
                                                      getRemappedInput (old.source));
    }